

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal.hpp
# Opt level: O0

void tao::pegtl::normal<queryparse::string_content>::
     raise<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::internal::state<tao::pegtl::parse_tree::node>&>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,state<tao::pegtl::parse_tree::node> *param_2)

{
  undefined8 uVar1;
  string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  string *in_RDI;
  parse_error *unaff_retaddr;
  undefined3 in_stack_ffffffffffffffa0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  
  uVar2 = CONCAT13(1,in_stack_ffffffffffffffa0);
  uVar1 = __cxa_allocate_exception(0x28);
  internal::demangle<queryparse::string_content>();
  std::operator+(in_stack_ffffffffffffffa8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffa4,uVar2));
  parse_error::
  parse_error<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
            (unaff_retaddr,in_RDI,in_RSI);
  __cxa_throw(uVar1,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

static void raise( const Input& in, States&&... /*unused*/ )
         {
            throw parse_error( "parse error matching " + internal::demangle< Rule >(), in );
         }